

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O0

void __thiscall Funcdata::warning(Funcdata *this,string *txt,Address *ad)

{
  CommentDatabase *pCVar1;
  string local_40 [8];
  string msg;
  Address *ad_local;
  string *txt_local;
  Funcdata *this_local;
  
  std::__cxx11::string::string(local_40);
  if ((this->flags & 0x80) == 0) {
    std::__cxx11::string::operator=(local_40,"WARNING: ");
  }
  else {
    std::__cxx11::string::operator=(local_40,"WARNING (jumptable): ");
  }
  std::__cxx11::string::operator+=(local_40,(string *)txt);
  pCVar1 = this->glb->commentdb;
  (*pCVar1->_vptr_CommentDatabase[5])(pCVar1,0x10,&this->baseaddr,ad,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Funcdata::warning(const string &txt,const Address &ad) const

{
  string msg;
  if ((flags & jumptablerecovery_on)!=0)
    msg = "WARNING (jumptable): ";
  else
    msg = "WARNING: ";
  msg += txt;
  glb->commentdb->addCommentNoDuplicate(Comment::warning,baseaddr,ad,msg);
}